

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_common.cpp
# Opt level: O3

void adios2::EVPathRemoteCommon::RegisterFormats(Remote_evpath_state *ev_state)

{
  CMFormat p_Var1;
  
  p_Var1 = (CMFormat)CMregister_format(ev_state->cm,OpenFileStructs);
  ev_state->OpenFileFormat = p_Var1;
  p_Var1 = (CMFormat)CMregister_format(ev_state->cm,OpenSimpleFileStructs);
  ev_state->OpenSimpleFileFormat = p_Var1;
  p_Var1 = (CMFormat)CMregister_format(ev_state->cm,OpenResponseStructs);
  ev_state->OpenResponseFormat = p_Var1;
  p_Var1 = (CMFormat)CMregister_format(ev_state->cm,OpenSimpleResponseStructs);
  ev_state->OpenSimpleResponseFormat = p_Var1;
  p_Var1 = (CMFormat)CMregister_format(ev_state->cm,GetRequestStructs);
  ev_state->GetRequestFormat = p_Var1;
  p_Var1 = (CMFormat)CMregister_format(ev_state->cm,ReadRequestStructs);
  ev_state->ReadRequestFormat = p_Var1;
  p_Var1 = (CMFormat)CMregister_format(ev_state->cm,ReadResponseStructs);
  ev_state->ReadResponseFormat = p_Var1;
  p_Var1 = (CMFormat)CMregister_format(ev_state->cm,CloseFileStructs);
  ev_state->CloseFileFormat = p_Var1;
  p_Var1 = (CMFormat)CMregister_format(ev_state->cm,KillServerStructs);
  ev_state->KillServerFormat = p_Var1;
  p_Var1 = (CMFormat)CMregister_format(ev_state->cm,KillResponseStructs);
  ev_state->KillResponseFormat = p_Var1;
  p_Var1 = (CMFormat)CMregister_format(ev_state->cm,StatusServerStructs);
  ev_state->StatusServerFormat = p_Var1;
  p_Var1 = (CMFormat)CMregister_format(ev_state->cm,StatusResponseStructs);
  ev_state->StatusResponseFormat = p_Var1;
  return;
}

Assistant:

void RegisterFormats(EVPathRemoteCommon::Remote_evpath_state &ev_state)
{
    ev_state.OpenFileFormat = CMregister_format(ev_state.cm, EVPathRemoteCommon::OpenFileStructs);
    ev_state.OpenSimpleFileFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::OpenSimpleFileStructs);
    ev_state.OpenResponseFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::OpenResponseStructs);
    ev_state.OpenSimpleResponseFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::OpenSimpleResponseStructs);
    ev_state.GetRequestFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::GetRequestStructs);
    ev_state.ReadRequestFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::ReadRequestStructs);
    ev_state.ReadResponseFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::ReadResponseStructs);
    ev_state.CloseFileFormat = CMregister_format(ev_state.cm, EVPathRemoteCommon::CloseFileStructs);
    ev_state.KillServerFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::KillServerStructs);
    ev_state.KillResponseFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::KillResponseStructs);
    ev_state.StatusServerFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::StatusServerStructs);
    ev_state.StatusResponseFormat =
        CMregister_format(ev_state.cm, EVPathRemoteCommon::StatusResponseStructs);
}